

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

void __thiscall QLayout::removeItem(QLayout *this,QLayoutItem *item)

{
  long lVar1;
  long in_RSI;
  long *in_RDI;
  QLayoutItem *child;
  int i;
  int local_14;
  
  local_14 = 0;
  while (lVar1 = (**(code **)(*in_RDI + 0xa8))(in_RDI,local_14), lVar1 != 0) {
    if (lVar1 == in_RSI) {
      (**(code **)(*in_RDI + 0xb0))(in_RDI,local_14);
      (**(code **)(*in_RDI + 0x70))();
    }
    else {
      local_14 = local_14 + 1;
    }
  }
  return;
}

Assistant:

void QLayout::removeItem(QLayoutItem *item)
{
    int i = 0;
    QLayoutItem *child;
    while ((child = itemAt(i))) {
        if (child == item) {
            takeAt(i);
            invalidate();
        } else {
            ++i;
        }
    }
}